

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics.cpp
# Opt level: O2

void __thiscall
piksel::Graphics::image
          (Graphics *this,Image *img,float dx,float dy,float dWidth,float dHeight,float sx,float sy,
          float sWidth,float sHeight)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  stack<piksel::State,_std::deque<piksel::State,_std::allocator<piksel::State>_>_> *psVar5;
  undefined1 auVar6 [16];
  PFNGLACTIVETEXTUREPROC *v;
  _Elt_pointer pSVar7;
  float fVar8;
  undefined1 auVar10 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined4 in_XMM4_Db;
  undefined4 in_XMM6_Db;
  undefined4 in_XMM6_Dd;
  undefined4 in_XMM7_Db;
  anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::qualifier)0>_3 local_c0;
  undefined1 local_b0 [12];
  col_type cStack_a4;
  undefined1 auStack_90 [12];
  col_type local_84;
  undefined4 local_74;
  anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::qualifier)0>_3 local_70;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  
  push(this);
  psVar5 = this->stateStack;
  pSVar7 = (psVar5->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (pSVar7 == (psVar5->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl
                .super__Deque_impl_data._M_finish._M_first) {
    pSVar7 = (psVar5->c).super__Deque_base<piksel::State,_std::allocator<piksel::State>_>._M_impl.
             super__Deque_impl_data._M_finish._M_node[-1] + 2;
  }
  if (pSVar7[-1].shaderIrrelevantState.tint == false) {
    pSVar7[-1].shaderRelevantState.tintColor.field_0.field_0.x = 1.0;
    pSVar7[-1].shaderRelevantState.tintColor.field_0.field_0.y = 1.0;
    pSVar7[-1].shaderRelevantState.tintColor.field_0.field_0.z = 1.0;
    pSVar7[-1].shaderRelevantState.tintColor.field_0.field_0.w = 1.0;
  }
  pSVar7[-1].shaderIrrelevantState.rectMode = pSVar7[-1].shaderIrrelevantState.imageMode;
  v = &glad_glActiveTexture;
  (*glad_glActiveTexture)(img->_index % 8 + 0x84c0);
  (*glad_glBindTexture)(0xde1,img->_texture);
  local_b0._0_4_ = 1.0;
  local_b0._4_4_ = 0.0;
  local_b0._8_4_ = 0.0;
  cStack_a4.field_0._0_8_ = 0;
  cStack_a4.field_0.field_0.z = 1.0;
  stack0xffffffffffffff68 = 0;
  auStack_90._0_8_ = 0;
  auStack_90._8_4_ = 1.0;
  local_84.field_0._0_8_ = 0;
  local_84.field_0._8_8_ = 0;
  local_74 = 1.0;
  uVar1 = img->width;
  uVar3 = img->height;
  fVar8 = (float)(int)uVar3;
  auVar13._4_4_ = in_XMM4_Db;
  auVar13._0_4_ = sx;
  auVar13._8_4_ = in_XMM4_Db;
  auVar13._12_4_ = fVar8;
  auVar12._8_8_ = auVar13._8_8_;
  auVar12._4_4_ = (fVar8 - sy) - sHeight;
  auVar12._0_4_ = sx;
  auVar14._4_4_ = fVar8;
  auVar14._0_4_ = (float)(int)uVar1;
  auVar14._8_8_ = 0;
  auVar14 = divps(auVar12,auVar14);
  local_c0._0_8_ = auVar14._0_8_;
  local_c0.field_0.z = 0.0;
  glm::translate<float,(glm::qualifier)0>
            ((mat<4,_4,_float,_(glm::qualifier)0> *)&local_70.field_0,(glm *)local_b0,
             (mat<4,_4,_float,_(glm::qualifier)0> *)&local_c0.field_0,
             (vec<3,_float,_(glm::qualifier)0> *)v);
  *(undefined8 *)&pSVar7[-1].shaderRelevantState.textureMatrix.value[3].field_0 = local_40;
  *(undefined8 *)((long)&pSVar7[-1].shaderRelevantState.textureMatrix.value[3].field_0 + 8) =
       uStack_38;
  *(undefined8 *)&pSVar7[-1].shaderRelevantState.textureMatrix.value[2].field_0 = local_50;
  *(undefined8 *)((long)&pSVar7[-1].shaderRelevantState.textureMatrix.value[2].field_0 + 8) =
       uStack_48;
  *(undefined8 *)&pSVar7[-1].shaderRelevantState.textureMatrix.value[1].field_0 = local_60;
  *(undefined8 *)((long)&pSVar7[-1].shaderRelevantState.textureMatrix.value[1].field_0 + 8) =
       uStack_58;
  *(undefined8 *)&pSVar7[-1].shaderRelevantState.textureMatrix.value[0].field_0 = local_70._0_8_;
  *(undefined8 *)((long)&pSVar7[-1].shaderRelevantState.textureMatrix.value[0].field_0 + 8) =
       local_70._8_8_;
  uVar2 = img->width;
  uVar4 = img->height;
  auVar10._4_4_ = in_XMM6_Db;
  auVar10._0_4_ = sWidth;
  auVar10._8_4_ = in_XMM6_Db;
  auVar10._12_4_ = in_XMM6_Dd;
  auVar9._8_8_ = auVar10._8_8_;
  auVar9._4_4_ = sHeight;
  auVar9._0_4_ = sWidth;
  auVar11._0_12_ = auVar9._0_12_;
  auVar11._12_4_ = in_XMM7_Db;
  auVar6._4_4_ = (float)(int)uVar4;
  auVar6._0_4_ = (float)(int)uVar2;
  auVar6._8_8_ = 0;
  auVar14 = divps(auVar11,auVar6);
  local_b0._0_4_ = auVar14._0_4_;
  local_b0._4_4_ = auVar14._4_4_;
  local_b0._8_4_ = 1.0;
  glm::scale<float,(glm::qualifier)0>
            ((mat<4,_4,_float,_(glm::qualifier)0> *)&local_70.field_0,
             (glm *)&pSVar7[-1].shaderRelevantState.textureMatrix,
             (mat<4,_4,_float,_(glm::qualifier)0> *)local_b0,(vec<3,_float,_(glm::qualifier)0> *)v);
  *(undefined8 *)&pSVar7[-1].shaderRelevantState.textureMatrix.value[3].field_0 = local_40;
  *(undefined8 *)((long)&pSVar7[-1].shaderRelevantState.textureMatrix.value[3].field_0 + 8) =
       uStack_38;
  *(undefined8 *)&pSVar7[-1].shaderRelevantState.textureMatrix.value[2].field_0 = local_50;
  *(undefined8 *)((long)&pSVar7[-1].shaderRelevantState.textureMatrix.value[2].field_0 + 8) =
       uStack_48;
  *(undefined8 *)&pSVar7[-1].shaderRelevantState.textureMatrix.value[1].field_0 = local_60;
  *(undefined8 *)((long)&pSVar7[-1].shaderRelevantState.textureMatrix.value[1].field_0 + 8) =
       uStack_58;
  *(undefined8 *)&pSVar7[-1].shaderRelevantState.textureMatrix.value[0].field_0 = local_70._0_8_;
  *(undefined8 *)((long)&pSVar7[-1].shaderRelevantState.textureMatrix.value[0].field_0 + 8) =
       local_70._8_8_;
  pSVar7[-1].shaderRelevantState.textureIndex = (float)(img->_index % 8);
  _rect(this,dx,dy,dWidth,dHeight);
  pop(this);
  return;
}

Assistant:

void Graphics::image(Image& img, float dx, float dy, float dWidth, float dHeight, float sx, float sy, float sWidth, float sHeight) {
    push();
    State& state = peek();
    if (!state.shaderIrrelevantState.tint) {
        state.shaderRelevantState.tintColor = glm::vec4(1.0f);
    }
    state.shaderIrrelevantState.rectMode = state.shaderIrrelevantState.imageMode;
    glActiveTexture(GL_TEXTURE0 + (img._index % 8));
	glBindTexture(GL_TEXTURE_2D, img._texture);
	state.shaderRelevantState.textureMatrix = glm::translate(glm::mat4(1.0f), glm::vec3(sx / img.width, (img.height - sy - sHeight) / img.height, 0.0f));
	state.shaderRelevantState.textureMatrix = glm::scale(state.shaderRelevantState.textureMatrix, glm::vec3(sWidth / img.width, sHeight / img.height, 1.0f));
    // state.shaderRelevantState.textureMatrix = glm::mat4(1.0f); // for debug
    state.shaderRelevantState.textureIndex = img._index % 8;
    _rect(dx, dy, dWidth, dHeight);
    pop();
}